

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void decode_c1_longExample_isSuccessful(void)

{
  bech32_error bVar1;
  int iVar2;
  bech32_DecodedResult *decodedResult_00;
  bech32_DecodedResult *decodedResult;
  char local_38;
  char expectedHrp [7];
  char bstr [46];
  
  memcpy(&local_38,"abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",0x2e);
  decodedResult._1_4_ = 0x64636261;
  decodedResult._5_2_ = 0x6665;
  decodedResult._7_1_ = 0;
  decodedResult_00 = bech32_create_DecodedResult(&local_38);
  bVar1 = bech32_decode(decodedResult_00,&local_38);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x182,"void decode_c1_longExample_isSuccessful(void)");
  }
  iVar2 = strcmp(decodedResult_00->hrp,(char *)((long)&decodedResult + 1));
  if (iVar2 != 0) {
    __assert_fail("strcmp(decodedResult->hrp, expectedHrp) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x183,"void decode_c1_longExample_isSuccessful(void)");
  }
  if (*decodedResult_00->dp != '\0') {
    __assert_fail("decodedResult->dp[0] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x184,"void decode_c1_longExample_isSuccessful(void)");
  }
  if (decodedResult_00->dp[0x1f] == '\x1f') {
    if (decodedResult_00->encoding == ENCODING_BECH32) {
      bech32_free_DecodedResult(decodedResult_00);
      return;
    }
    __assert_fail("ENCODING_BECH32 == decodedResult->encoding",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x186,"void decode_c1_longExample_isSuccessful(void)");
  }
  __assert_fail("decodedResult->dp[31] == \'\\x1f\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x185,"void decode_c1_longExample_isSuccessful(void)");
}

Assistant:

void decode_c1_longExample_isSuccessful(void) {
    char bstr[] = "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw";
    char expectedHrp[] = "abcdef";

    bech32_DecodedResult * decodedResult = bech32_create_DecodedResult(bstr);

    assert(bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS);
    assert(strcmp(decodedResult->hrp, expectedHrp) == 0);
    assert(decodedResult->dp[0] == '\0');    // first 'q' in above dp part
    assert(decodedResult->dp[31] == '\x1f'); // last 'l' in above dp part
    assert(ENCODING_BECH32 == decodedResult->encoding);

    bech32_free_DecodedResult(decodedResult);
}